

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algo_iterable.h
# Opt level: O2

strong_type_from_t<ezy::remove_cvref_t<flattened_range_view<keeper<owner_category_tag,_vector<vector<int,_allocator<int>_>,_allocator<vector<int,_allocator<int>_>_>_>_>_>_>,_ezy::notag_t,_ezy::extract_features_t<strong_type<vector<vector<int,_allocator<int>_>,_allocator<vector<int,_allocator<int>_>_>_>,_RaisedTag,_iterable>_>_>
* __thiscall
ezy::features::algo_iterable::
impl<ezy::strong_type<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_RaisedTag,_ezy::features::iterable>_>
::flatten(strong_type_from_t<ezy::remove_cvref_t<flattened_range_view<keeper<owner_category_tag,_vector<vector<int,_allocator<int>_>,_allocator<vector<int,_allocator<int>_>_>_>_>_>_>,_ezy::notag_t,_ezy::extract_features_t<strong_type<vector<vector<int,_allocator<int>_>,_allocator<vector<int,_allocator<int>_>_>_>,_RaisedTag,_iterable>_>_>
          *__return_storage_ptr__,
         impl<ezy::strong_type<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_RaisedTag,_ezy::features::iterable>_>
         *this)

{
  pointer pvVar1;
  undefined8 uVar2;
  pointer pvVar3;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_28;
  
  pvVar1 = *(pointer *)(this + 0x10);
  uVar2 = *(undefined8 *)this;
  pvVar3 = *(pointer *)(this + 8);
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super_strong_type_base<ezy::detail::flattened_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_true>
    ).
    super_strong_type_payload<ezy::detail::flattened_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_true>
    ._value.range.t.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl = uVar2;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super_strong_type_base<ezy::detail::flattened_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_true>
           ).
           super_strong_type_payload<ezy::detail::flattened_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_true>
           ._value.range.t.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl + 8) = pvVar3;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super_strong_type_base<ezy::detail::flattened_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_true>
           ).
           super_strong_type_payload<ezy::detail::flattened_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_true>
           ._value.range.t.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl + 0x10) = pvVar1;
  local_28.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

auto flatten() &&
      {
        return detail::make_extended_from<T>(
          ezy::flatten(static_cast<T&&>(*this).get())
        );
      }